

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O2

void __thiscall wasm::ReFinalize::visitBlock(ReFinalize *this,Block *curr)

{
  ExpressionList *this_00;
  uintptr_t uVar1;
  ArenaVector<wasm::Expression_*> *pAVar2;
  iterator iVar3;
  Expression **ppEVar4;
  Type TVar5;
  undefined1 local_38 [8];
  Iterator __begin2;
  
  if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements == 0) {
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
  }
  else {
    this_00 = &curr->list;
    if (((curr->name).super_IString.str._M_str != (char *)0x0) &&
       (iVar3 = std::
                _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->breakTypes)._M_h,&curr->name),
       iVar3.
       super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
       ._M_cur != (__node_type *)0x0)) {
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      std::__detail::
      _Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)((long)iVar3.
                         super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
                         ._M_cur + 0x18),&(*ppEVar4)->type);
      TVar5 = wasm::Type::
              getLeastUpperBound<std::unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>>
                        ((unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>
                          *)((long)iVar3.
                                   super__Node_iterator_base<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_true>
                                   ._M_cur + 0x18));
      (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = TVar5.id;
      return;
    }
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&this_00->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    uVar1 = ((*ppEVar4)->type).id;
    (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = uVar1;
    if (uVar1 == 0) {
      __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
      pAVar2 = (ArenaVector<wasm::Expression_*> *)
               (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
      local_38 = (undefined1  [8])this_00;
      while( true ) {
        if ((__begin2.parent == pAVar2) && (local_38 == (undefined1  [8])this_00)) {
          return;
        }
        ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                  operator*((Iterator *)local_38);
        if (((*ppEVar4)->type).id == 1) break;
        __begin2.parent =
             (ArenaVector<wasm::Expression_*> *)
             ((long)&((__begin2.parent)->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).
                     data + 1);
      }
      (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 1;
    }
  }
  return;
}

Assistant:

void ReFinalize::visitBlock(Block* curr) {
  if (curr->list.size() == 0) {
    curr->type = Type::none;
    return;
  }
  if (curr->name.is()) {
    auto iter = breakTypes.find(curr->name);
    if (iter != breakTypes.end()) {
      // Set the type to be a supertype of the branch types and the flowed-out
      // type. TODO: calculate proper LUBs to compute a new correct type in this
      // situation.
      auto& types = iter->second;
      types.insert(curr->list.back()->type);
      curr->type = Type::getLeastUpperBound(types);
      return;
    }
  }
  curr->type = curr->list.back()->type;
  if (curr->type == Type::unreachable) {
    return;
  }
  // type is none, but we might be unreachable
  if (curr->type == Type::none) {
    for (auto* child : curr->list) {
      if (child->type == Type::unreachable) {
        curr->type = Type::unreachable;
        break;
      }
    }
  }
}